

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O1

int Io_ReadPlaRemoveMarked(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (nCubes < 1) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar5 = (ulong)(uint)vMarks->nSize;
    if (vMarks->nSize < 1) {
      uVar5 = uVar6;
    }
    uVar4 = 0;
    do {
      if (uVar6 == uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      uVar1 = uVar4;
      if (((((uint)vMarks->pArray[uVar6 >> 5 & 0x7ffffff] >> ((uint)uVar6 & 0x1f) & 1) == 0) &&
          (uVar1 = uVar4 + 1, uVar6 != uVar4)) && (0 < nWords)) {
        pwVar2 = pCs[(int)uVar4];
        pwVar3 = pCs[uVar6];
        uVar7 = 0;
        do {
          pwVar2[uVar7] = pwVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while ((uint)nWords != uVar7);
      }
      uVar4 = uVar1;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nCubes);
  }
  return uVar4;
}

Assistant:

int Io_ReadPlaRemoveMarked( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c;
    for ( c1 = c = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
        {
            if ( c == c1 )
                c++;
            else
                Abc_TtCopy( pCs[c++], pCs[c1], nWords, 0 );
        }
    return c;
}